

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall
draco::ObjEncoder::EncodeToBuffer(ObjEncoder *this,PointCloud *pc,EncoderBuffer *out_buffer)

{
  bool bVar1;
  
  this->in_point_cloud_ = pc;
  this->out_buffer_ = out_buffer;
  bVar1 = EncodeInternal(this);
  this->pos_att_ = (PointAttribute *)0x0;
  this->tex_coord_att_ = (PointAttribute *)0x0;
  this->normal_att_ = (PointAttribute *)0x0;
  this->material_att_ = (PointAttribute *)0x0;
  this->sub_obj_att_ = (PointAttribute *)0x0;
  this->added_edges_att_ = (PointAttribute *)0x0;
  this->out_buffer_ = (EncoderBuffer *)0x0;
  this->in_point_cloud_ = (PointCloud *)0x0;
  this->in_mesh_ = (Mesh *)0x0;
  this->current_sub_obj_id_ = -1;
  this->current_material_id_ = -1;
  (this->file_name_)._M_string_length = 0;
  *(this->file_name_)._M_dataplus._M_p = '\0';
  return bVar1;
}

Assistant:

bool ObjEncoder::EncodeToBuffer(const PointCloud &pc,
                                EncoderBuffer *out_buffer) {
  in_point_cloud_ = &pc;
  out_buffer_ = out_buffer;
  if (!EncodeInternal()) {
    return ExitAndCleanup(false);
  }
  return ExitAndCleanup(true);
}